

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O3

void __thiscall
embree::Geometry::setInstancedScenes(Geometry *this,RTCScene *scenes,size_t numScenes)

{
  undefined8 *puVar1;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"operation not supported for this geometry","");
  *puVar1 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar1 + 1) = 3;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

virtual void setInstancedScenes(const RTCScene* scenes, size_t numScenes) {
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"operation not supported for this geometry");
    }